

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboRepeatedClearSampleTex2DCase::render
          (FboRepeatedClearSampleTex2DCase *this,Surface *dst)

{
  deUint32 program;
  DataType DVar1;
  DataTypes *samplerTypes;
  Context *pCVar2;
  Vector<float,_3> local_2c4;
  Vector<float,_3> local_2b8;
  undefined1 local_2ac [8];
  Vec4 color;
  int cellX;
  int cellY;
  int local_284;
  deUint32 dStack_280;
  int fboNdx;
  deUint32 textures [2];
  deUint32 fbos [2];
  Random rnd;
  deUint32 fboBlitShaderID;
  Vector<float,_4> local_24c;
  float local_230 [2];
  DataTypes local_228;
  undefined1 local_208 [8];
  Texture2DShader fboBlitShader;
  int fboSizes [2];
  int cellSize;
  int numRowsCols;
  TextureFormatInfo fmtInfo;
  TextureFormat fboFormat;
  Surface *dst_local;
  FboRepeatedClearSampleTex2DCase *this_local;
  
  fmtInfo.lookupBias.m_data._8_8_ =
       glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&cellSize,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  fboBlitShader.m_outputType = TYPE_DOUBLE_VEC3;
  fboBlitShader._404_4_ = 0x40;
  local_228.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_228);
  local_230[0] = fmtInfo.lookupBias.m_data[2];
  local_230[1] = fmtInfo.lookupBias.m_data[3];
  DVar1 = glu::getSampler2DType((TextureFormat)fmtInfo.lookupBias.m_data._8_8_);
  samplerTypes = FboTestUtil::DataTypes::operator<<(&local_228,DVar1);
  DVar1 = FboTestUtil::getFragmentOutputType((TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  tcu::Vector<float,_4>::Vector(&local_24c,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&rnd.m_rnd.w,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_208,samplerTypes,DVar1,&local_24c,(Vec4 *)&rnd.m_rnd.w);
  FboTestUtil::DataTypes::~DataTypes(&local_228);
  pCVar2 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  rnd.m_rnd.z = (*pCVar2->_vptr_Context[0x75])(pCVar2,local_208);
  de::Random::Random((Random *)fbos,0x1153f3e);
  textures[0] = 0;
  textures[1] = 0;
  _dStack_280 = 0;
  sglr::ContextWrapper::glGenFramebuffers
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,2,textures);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,2,&dStack_280)
  ;
  for (local_284 = 0; local_284 < 2; local_284 = local_284 + 1) {
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,
               (&dStack_280)[local_284]);
    sglr::ContextWrapper::glTexStorage2D
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,1,
               (this->super_FboColorbufferCase).m_format,
               *(DataType *)((long)(&fboBlitShader.m_outBias + 1) + (long)local_284 * 4),
               *(DataType *)((long)(&fboBlitShader.m_outBias + 1) + (long)local_284 * 4));
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2802
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2803
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2801
               ,0x2600);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2800
               ,0x2600);
    FboTestCase::checkError((FboTestCase *)this);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
               textures[local_284]);
    sglr::ContextWrapper::glFramebufferTexture2D
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
               0x8ce0,0xde1,(&dStack_280)[local_284],0);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cellX,0.0);
  FboTestCase::clearColorBuffer
            ((FboTestCase *)this,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2),(Vec4 *)&cellX);
  pCVar2 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_208,pCVar2,rnd.m_rnd.z);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,
             dStack_280);
  for (color.m_data[3] = 0.0; (int)color.m_data[3] < 4;
      color.m_data[3] = (float)((int)color.m_data[3] + 1)) {
    for (color.m_data[2] = 0.0; (int)color.m_data[2] < 4;
        color.m_data[2] = (float)((int)color.m_data[2] + 1)) {
      randomVector<4>((Functional *)local_2ac,(Random *)fbos,(Vector<float,_4> *)&cellSize,
                      (Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2));
      sglr::ContextWrapper::glBindFramebuffer
                (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
                 textures[0]);
      FboTestCase::clearColorBuffer
                ((FboTestCase *)this,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2),
                 (Vec4 *)local_2ac);
      sglr::ContextWrapper::glBindFramebuffer
                (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
                 textures[1]);
      sglr::ContextWrapper::glViewport
                (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,
                 (int)color.m_data[2] << 4,(int)color.m_data[3] << 4,0x10,0x10);
      pCVar2 = sglr::ContextWrapper::getCurrentContext
                         (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
      program = rnd.m_rnd.z;
      tcu::Vector<float,_3>::Vector(&local_2b8,-1.0,-1.0,0.0);
      tcu::Vector<float,_3>::Vector(&local_2c4,1.0,1.0,0.0);
      sglr::drawQuad(pCVar2,program,&local_2b8,&local_2c4);
    }
  }
  FboTestCase::readPixels
            ((FboTestCase *)this,dst,0,0,fboBlitShader._404_4_,fboBlitShader._404_4_,
             (TextureFormat *)(fmtInfo.lookupBias.m_data + 2),(Vec4 *)(fmtInfo.valueMax.m_data + 2),
             (Vec4 *)(fmtInfo.lookupScale.m_data + 2));
  FboTestCase::checkError((FboTestCase *)this);
  de::Random::~Random((Random *)fbos);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_208);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const tcu::TextureFormat		fboFormat		= glu::mapGLInternalFormat(m_format);
		const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(fboFormat);
		const int						numRowsCols		= 4;
		const int						cellSize		= 16;
		const int						fboSizes[]		= { cellSize, cellSize*numRowsCols };

		Texture2DShader					fboBlitShader	(DataTypes() << glu::getSampler2DType(fboFormat), getFragmentOutputType(fboFormat), Vec4(1.0f), Vec4(0.0f));
		const deUint32					fboBlitShaderID	= getCurrentContext()->createProgram(&fboBlitShader);

		de::Random						rnd				(18169662);
		deUint32						fbos[]			= { 0, 0 };
		deUint32						textures[]		= { 0, 0 };

		glGenFramebuffers(2, &fbos[0]);
		glGenTextures(2, &textures[0]);

		for (int fboNdx = 0; fboNdx < DE_LENGTH_OF_ARRAY(fbos); fboNdx++)
		{
			glBindTexture(GL_TEXTURE_2D, textures[fboNdx]);
			glTexStorage2D(GL_TEXTURE_2D, 1, m_format, fboSizes[fboNdx], fboSizes[fboNdx]);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
			checkError();

			glBindFramebuffer(GL_FRAMEBUFFER, fbos[fboNdx]);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textures[fboNdx], 0);
			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		// larger fbo bound -- clear to transparent black
		clearColorBuffer(fboFormat, Vec4(0.0f));

		fboBlitShader.setUniforms(*getCurrentContext(), fboBlitShaderID);
		glBindTexture(GL_TEXTURE_2D, textures[0]);

		for (int cellY = 0; cellY < numRowsCols; cellY++)
		for (int cellX = 0; cellX < numRowsCols; cellX++)
		{
			const Vec4	color	= randomVector<4>(rnd, fmtInfo.valueMin, fmtInfo.valueMax);

			glBindFramebuffer(GL_FRAMEBUFFER, fbos[0]);
			clearColorBuffer(fboFormat, color);

			glBindFramebuffer(GL_FRAMEBUFFER, fbos[1]);
			glViewport(cellX*cellSize, cellY*cellSize, cellSize, cellSize);
			sglr::drawQuad(*getCurrentContext(), fboBlitShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		readPixels(dst, 0, 0, fboSizes[1], fboSizes[1], fboFormat, fmtInfo.lookupScale, fmtInfo.lookupBias);
		checkError();
	}